

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void * kj::Thread::runThread(void *ptr)

{
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  anon_class_8_1_a8a4b3b1 *in_RDX;
  Exception *exception;
  undefined1 local_350 [416];
  undefined1 local_1b0 [8];
  NullableValue<kj::Exception> _exception181;
  ThreadState *state;
  void *ptr_local;
  
  local_350._0_8_ = (long)&_exception181.field_1 + 0x188;
  _exception181.field_1.value.details.builder.disposer = (ArrayDisposer *)ptr;
  runCatchingExceptions<kj::Thread::runThread(void*)::__0>
            ((Maybe<kj::Exception> *)(local_350 + 8),(kj *)local_350,in_RDX);
  other = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_350 + 8));
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_1b0,other);
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_350 + 8));
  pEVar1 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b0);
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = kj::_::NullableValue<kj::Exception>::operator*
                       ((NullableValue<kj::Exception> *)local_1b0);
    pEVar1 = mv<kj::Exception>(pEVar1);
    Maybe<kj::Exception>::operator=
              ((Maybe<kj::Exception> *)(_exception181.field_1.value.details.builder.disposer + 4),
               pEVar1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b0);
  ThreadState::unref((ThreadState *)_exception181.field_1.value.details.builder.disposer);
  return (void *)0x0;
}

Assistant:

void* Thread::runThread(void* ptr) {
#endif
  ThreadState* state = reinterpret_cast<ThreadState*>(ptr);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    state->initializer(kj::mv(state->func));
  })) {
    state->exception = kj::mv(exception);
  }
  state->unref();
  return 0;
}